

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

int Js::AssertIntegerProperty(DynamicObject *state,PropertyIds propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double value;
  int32 local_1c;
  Var pvStack_18;
  int ret;
  Var propertyValue;
  
  pvStack_18 = (Var)0x0;
  JavascriptOperators::GetProperty
            (&state->super_RecyclableObject,propertyId._value,&stack0xffffffffffffffe8,
             (((((state->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,(PropertyValueInfo *)0x0);
  if (pvStack_18 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x183,"(propertyValue)","propertyValue");
    if (!bVar2) goto LAB_00a32f99;
    *puVar3 = 0;
  }
  bVar2 = TaggedInt::Is(pvStack_18);
  if (bVar2) {
    local_1c = TaggedInt::ToInt32(pvStack_18);
  }
  else {
    if ((ulong)pvStack_18 >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x18b,"(JavascriptNumber::Is(propertyValue))",
                                  "JavascriptNumber::Is(propertyValue)");
      if (!bVar2) goto LAB_00a32f99;
      *puVar3 = 0;
    }
    value = JavascriptNumber::GetValue(pvStack_18);
    bVar2 = JavascriptNumber::TryGetInt32Value<false>(value,&local_1c);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x18d,
                                  "(JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret))"
                                  ,
                                  "JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret)"
                                 );
      if (!bVar2) {
LAB_00a32f99:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return local_1c;
}

Assistant:

static int AssertIntegerProperty(_In_ DynamicObject *state, _In_ PropertyIds propertyId)
    {
        Var propertyValue = nullptr;
        JavascriptOperators::GetProperty(state, propertyId, &propertyValue, state->GetScriptContext());

        AssertOrFailFast(propertyValue);

        if (TaggedInt::Is(propertyValue))
        {
            return TaggedInt::ToInt32(propertyValue);
        }
        else
        {
            AssertOrFailFast(JavascriptNumber::Is(propertyValue));
            int ret;
            AssertOrFailFast(JavascriptNumber::TryGetInt32Value(JavascriptNumber::GetValue(propertyValue), &ret));

            return ret;
        }
    }